

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O0

int pt_insn_at_disabled_event(pt_event *ev,pt_insn *insn,pt_insn_ext *iext,pt_config *config)

{
  int iVar1;
  uint64_t ip;
  pt_config *config_local;
  pt_insn_ext *iext_local;
  pt_insn *insn_local;
  pt_event *ev_local;
  
  if ((((ev == (pt_event *)0x0) || (insn == (pt_insn *)0x0)) || (iext == (pt_insn_ext *)0x0)) ||
     (config == (pt_config *)0x0)) {
    return -1;
  }
  if ((ev->field_0x4 & 1) == 0) {
    switch(insn->iclass) {
    case ptic_error:
      return -0xe;
    case ptic_other:
    case ptic_ptwrite:
      break;
    case ptic_call:
    case ptic_jump:
      if ((iext->variant).branch.is_direct == '\0') {
        return 1;
      }
      if ((long)(iext->variant).branch.displacement + (ulong)insn->size + insn->ip ==
          (ev->variant).enabled.ip) {
        return 1;
      }
      break;
    case ptic_return:
    case ptic_cond_jump:
    case ptic_far_call:
    case ptic_far_return:
    case ptic_far_jump:
    case ptic_indirect:
      return 1;
    }
  }
  else {
    iVar1 = pt_insn_is_far_branch(insn,iext);
    if (((iVar1 != 0) || (iVar1 = pt_insn_changes_cpl(insn,iext), iVar1 != 0)) ||
       (iVar1 = pt_insn_changes_cr3(insn,iext), iVar1 != 0)) {
      return 1;
    }
    if ((((config->addr_filter).config.addr_cfg != 0) &&
        ((*(ushort *)&config->errata >> 5 & 1) != 0)) &&
       (iVar1 = pt_insn_at_skl014(ev,insn,iext,config), iVar1 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int pt_insn_at_disabled_event(const struct pt_event *ev,
				     const struct pt_insn *insn,
				     const struct pt_insn_ext *iext,
				     const struct pt_config *config)
{
	if (!ev || !insn || !iext || !config)
		return -pte_internal;

	if (ev->ip_suppressed) {
		if (pt_insn_is_far_branch(insn, iext) ||
		    pt_insn_changes_cpl(insn, iext) ||
		    pt_insn_changes_cr3(insn, iext))
			return 1;

		/* If we don't have a filter configuration we assume that no
		 * address filters were used and the erratum does not apply.
		 *
		 * We might otherwise disable tracing too early.
		 */
		if (config->addr_filter.config.addr_cfg &&
		    config->errata.skl014 &&
		    pt_insn_at_skl014(ev, insn, iext, config))
			return 1;
	} else {
		switch (insn->iclass) {
		case ptic_ptwrite:
		case ptic_other:
			break;

		case ptic_call:
		case ptic_jump:
			/* If we got an IP with the disabled event, we may
			 * ignore direct branches that go to a different IP.
			 */
			if (iext->variant.branch.is_direct) {
				uint64_t ip;

				ip = insn->ip;
				ip += insn->size;
				ip += (uint64_t) (int64_t)
					iext->variant.branch.displacement;

				if (ip != ev->variant.disabled.ip)
					break;
			}

			fallthrough;
		case ptic_return:
		case ptic_far_call:
		case ptic_far_return:
		case ptic_far_jump:
		case ptic_indirect:
		case ptic_cond_jump:
			return 1;

		case ptic_unknown:
			return -pte_bad_insn;
		}
	}

	return 0;
}